

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_tester.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::CommandLineInterfaceTester::CommandLineInterfaceTester
          (CommandLineInterfaceTester *this)

{
  string *name;
  bool bVar1;
  Nonnull<const_char_*> failure_msg;
  long *local_d0;
  StatusRep *local_c8;
  long local_c0 [2];
  LogMessageFatal local_b0 [3];
  string local_80;
  AlphaNum local_60;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__CommandLineInterfaceTester_018f7ea8;
  CommandLineInterface::CommandLineInterface(&this->cli_);
  name = &this->temp_directory_;
  (this->temp_directory_)._M_dataplus._M_p = (pointer)&(this->temp_directory_).field_2;
  (this->temp_directory_)._M_string_length = 0;
  (this->temp_directory_).field_2._M_local_buf[0] = '\0';
  (this->captured_stderr_)._M_dataplus._M_p = (pointer)&(this->captured_stderr_).field_2;
  (this->captured_stderr_)._M_string_length = 0;
  (this->captured_stderr_).field_2._M_local_buf[0] = '\0';
  (this->captured_stdout_)._M_dataplus._M_p = (pointer)&(this->captured_stdout_).field_2;
  (this->captured_stdout_)._M_string_length = 0;
  (this->captured_stdout_).field_2._M_local_buf[0] = '\0';
  (this->generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generators_).
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::CodeGenerator,_std::default_delete<google::protobuf::compiler::CodeGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TestTempDir_abi_cxx11_();
  local_b0[0].super_LogMessage._0_8_ = local_c8;
  local_60.piece_._M_len = 0x15;
  local_60.piece_._M_str = "/proto2_cli_test_temp";
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_80,(lts_20250127 *)local_b0,&local_60,(AlphaNum *)local_c8);
  std::__cxx11::string::operator=((string *)name,(string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0,local_c0[0] + 1);
  }
  bVar1 = File::Exists(name);
  if (bVar1) {
    File::DeleteRecursively(name,(void *)0x0,(void *)0x0);
  }
  File::CreateDir((File *)local_b0,name,0x1ff);
  if ((StatusRep *)local_b0[0].super_LogMessage._0_8_ == (StatusRep *)0x1) {
    return;
  }
  failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_b0,
                           "File::CreateDir(temp_directory_, 0777) is OK");
  if ((local_b0[0].super_LogMessage._0_8_ & 1) == 0) {
    absl::lts_20250127::status_internal::StatusRep::Unref
              ((StatusRep *)local_b0[0].super_LogMessage._0_8_);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (local_b0,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/command_line_interface_tester.cc"
             ,0x32,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(local_b0);
}

Assistant:

CommandLineInterfaceTester::CommandLineInterfaceTester() {
  temp_directory_ = absl::StrCat(TestTempDir(), "/proto2_cli_test_temp");

  // If the temp directory already exists, it must be left over from a
  // previous run.  Delete it.
  if (FileExists(temp_directory_)) {
    File::DeleteRecursively(temp_directory_, NULL, NULL);
  }

  // Create the temp directory.
  ABSL_CHECK_OK(File::CreateDir(temp_directory_, 0777));
}